

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,write_shape>
          (xr_writer *this,
          vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_> *container)

{
  bool bVar1;
  reference s;
  __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::begin(container);
  local_30._M_current =
       (shape_def *)
       std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    s = __gnu_cxx::
        __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
        ::operator*(&end);
    write_shape::operator()((write_shape *)((long)&this_local + 7),s,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}